

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void flatcc_json_printer_uint8_vector_base64_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,int urlsafe)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  uint8_t *dst;
  int mode;
  uint8_t *puVar5;
  ulong uVar6;
  uint *puVar7;
  uint8_t *src;
  ulong uVar8;
  size_t data_len;
  ulong local_40;
  ulong local_38;
  
  mode = (int)len;
  uVar4 = id * 2 + 4;
  if ((uVar4 < (uint)td->vsize) &&
     (uVar8 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar4), uVar8 != 0)) {
    puVar7 = (uint *)(uVar8 + (long)td->table);
    iVar1 = td->count;
    td->count = iVar1 + 1;
    if (iVar1 != 0) {
      pcVar3 = ctx->p;
      ctx->p = pcVar3 + 1;
      *pcVar3 = ',';
    }
    print_name(ctx,name,len);
    uVar4 = *puVar7;
    uVar2 = *(uint *)((long)puVar7 + (ulong)uVar4);
    local_40 = (ulong)uVar2;
    pcVar3 = ctx->p;
    ctx->p = pcVar3 + 1;
    *pcVar3 = '\"';
    uVar8 = SUB168(ZEXT416(uVar2) * (undefined1  [16])0x4 * ZEXT816(0x5555555555555556),8) + 3U &
            0xfffffffffffffffc;
    puVar5 = (uint8_t *)ctx->pflush;
    dst = (uint8_t *)ctx->p;
    if (puVar5 <= dst + uVar8) {
      (*ctx->flush)(ctx,0);
      puVar5 = (uint8_t *)ctx->pflush;
      dst = (uint8_t *)ctx->p;
    }
    src = (uint8_t *)((long)puVar7 + (ulong)uVar4 + 4);
    while (puVar5 < dst + uVar8) {
      uVar8 = (long)puVar5 - (long)dst & 0xfffffffffffffffc;
      if (uVar8 == 0) {
        __assert_fail("n > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/json_printer.c"
                      ,0x13c,
                      "void print_uint8_vector_base64_object(flatcc_json_printer_t *, const void *, int)"
                     );
      }
      uVar6 = uVar8 * 3 >> 2;
      local_38 = uVar6;
      base64_encode(dst,src,&local_38,(size_t *)(ulong)(urlsafe != 0),mode);
      ctx->p = ctx->p + uVar8;
      src = src + uVar6;
      uVar6 = local_40 - uVar6;
      local_40 = uVar6;
      (*ctx->flush)(ctx,0);
      uVar8 = (uVar6 * 4) / 3 + 3 & 0xfffffffffffffffc;
      dst = (uint8_t *)ctx->p;
      puVar5 = (uint8_t *)ctx->pflush;
    }
    base64_encode(dst,src,&local_40,(size_t *)(ulong)(urlsafe != 0 | 0x80),mode);
    pcVar3 = ctx->p;
    ctx->p = pcVar3 + uVar8 + 1;
    pcVar3[uVar8] = '\"';
  }
  return;
}

Assistant:

void flatcc_json_printer_uint8_vector_base64_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len, int urlsafe)
{
    const void *p = get_field_ptr(td, id);
    int mode;

    mode = urlsafe ? base64_mode_url : base64_mode_rfc4648;
    mode |= base64_enc_modifier_padding;

    if (p) {
        if (td->count++) {
            print_char(',');
        }
        print_name(ctx, name, len);
        print_uint8_vector_base64_object(ctx, read_uoffset_ptr(p), mode);
    }
}